

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initest.c
# Opt level: O0

void pacf_mle(double *vec,int N,double *par,int M)

{
  double *residuals;
  double *theta_00;
  double *phi_00;
  double *varcovar_00;
  double eps_00;
  int ret;
  int k;
  int mean;
  int p;
  int i;
  double *res;
  double *varcovar;
  double *theta;
  double *phi;
  double eps;
  double thetac;
  double var;
  double *pdStack_38;
  int M_local;
  double *par_local;
  double *pdStack_28;
  int N_local;
  double *vec_local;
  
  var._4_4_ = M;
  pdStack_38 = par;
  par_local._4_4_ = N;
  pdStack_28 = vec;
  residuals = (double *)malloc((long)N << 3);
  theta_00 = (double *)malloc(0);
  eps_00 = macheps();
  for (mean = 0; mean < var._4_4_; mean = mean + 1) {
    phi_00 = (double *)malloc((long)(mean + 1) << 3);
    varcovar_00 = (double *)malloc((long)(mean + 2) * 8 * (long)(mean + 2));
    nlalsm(pdStack_28,par_local._4_4_,mean + 1,0,0,phi_00,theta_00,1,&eps,&thetac,eps_00,varcovar_00
           ,residuals);
    pdStack_38[mean] = phi_00[mean];
    free(phi_00);
    free(varcovar_00);
  }
  free(theta_00);
  free(residuals);
  return;
}

Assistant:

void pacf_mle(double* vec, int N, double* par, int M) {
	// Using Box-Jenkins Conditional MLE
	double var, thetac, eps;
	double *phi, *theta, *varcovar, *res;
	int i, p, mean, k,ret;

	res = (double*)malloc(sizeof(double)* N);
	theta = (double*)malloc(sizeof(double)* 0);

	eps = macheps();
	mean = 1;

	for (i = 0; i < M; ++i) {
		p = i + 1;
		k = p + mean;
		phi = (double*)malloc(sizeof(double)* p);
		varcovar = (double*)malloc(sizeof(double)* k * k);
		ret = nlalsm(vec, N, p, 0, 0, phi, theta, mean, &thetac, &var, eps, varcovar, res);
		//ret = css(vec, N, 6, p, 0, 0, phi, theta, &thetac, &var, res, &loglik, varcovar);
		par[i] = phi[i];
		free(phi);
		free(varcovar);
	}

	free(theta);
	free(res);
}